

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FiniteModelMultiSorted.cpp
# Opt level: O3

bool __thiscall
FMB::FiniteModelMultiSorted::evaluate(FiniteModelMultiSorted *this,Formula *formula,uint depth)

{
  uint var;
  uint uVar1;
  Literal *lit;
  uint *puVar2;
  size_type sVar3;
  FiniteModelMultiSorted *this_00;
  bool bVar4;
  bool bVar5;
  byte bVar6;
  int iVar7;
  Formula *pFVar8;
  Term *__addr;
  undefined8 *puVar9;
  long *plVar10;
  uint *puVar11;
  Literal *pLVar12;
  long *plVar13;
  byte bVar14;
  uint uVar15;
  byte bVar16;
  undefined8 unaff_R12;
  ulong uVar17;
  uint uVar18;
  void **head;
  byte bVar19;
  undefined1 auVar20 [12];
  undefined7 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebf;
  char cVar21;
  undefined8 in_stack_fffffffffffffec0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined1 local_130 [32];
  undefined4 uStack_110;
  undefined4 local_10c;
  FiniteModelMultiSorted *local_108;
  string local_100;
  Formula *local_e0;
  TermList local_d8;
  long *local_d0;
  long local_c8;
  long local_c0;
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  string local_b0;
  long local_90;
  long local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  uVar15 = depth + 1;
  bVar14 = 0;
  for (; formula->_connective == NOT; formula = *(Formula **)(formula + 1)) {
    bVar14 = bVar14 ^ 1;
    uVar15 = uVar15 + 1;
  }
  puVar11 = &switchD_002a61f6::switchdataD_008d18f4;
  switch(formula->_connective) {
  case LITERAL:
    lit = *(Literal **)(formula + 1);
    iVar7 = 0;
    pLVar12 = lit;
    if (*(int *)&(lit->super_Term).field_0xc < 0) {
      iVar7 = 0;
      do {
        pLVar12 = *(Literal **)&(pLVar12->super_Term).field_9._vars;
        if (((ulong)pLVar12 & 1) != 0) {
          uVar15 = 3;
          goto LAB_002a6225;
        }
        iVar7 = iVar7 + 2;
      } while (*(int *)&(pLVar12->super_Term).field_0xc < 0);
    }
    uVar15 = (pLVar12->super_Term).field_9._vars;
LAB_002a6225:
    if (iVar7 + uVar15 != 0) {
      puVar9 = (undefined8 *)__cxa_allocate_exception(0x50);
      Kernel::Formula::toString_abi_cxx11_((string *)local_130,formula);
      std::operator+(&local_70,"Was not expecting free variables in ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130)
      ;
      *puVar9 = &PTR_cry_00b3dfc0;
      puVar9[1] = puVar9 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar9 + 1),local_70._M_dataplus._M_p,
                 local_70._M_dataplus._M_p + local_70._M_string_length);
      *puVar9 = &PTR_cry_00b3e0a8;
      *(undefined4 *)(puVar9 + 5) = 0;
      puVar9[6] = puVar9 + 8;
      puVar9[7] = 0;
      *(undefined1 *)(puVar9 + 8) = 0;
      __cxa_throw(puVar9,&Lib::UserErrorException::typeinfo,
                  Lib::UserErrorException::~UserErrorException);
    }
    bVar6 = evaluateGroundLiteral(this,lit);
    goto LAB_002a64a8;
  case AND:
    bVar6 = 1;
    break;
  case OR:
    bVar6 = 0;
    break;
  case IMP:
    bVar16 = 1;
    bVar19 = 1;
    goto LAB_002a6267;
  case IFF:
    bVar16 = 1;
    goto LAB_002a6264;
  case XOR:
    bVar16 = 0;
LAB_002a6264:
    bVar19 = 0;
LAB_002a6267:
    pFVar8 = (Formula *)formula[1]._label._M_dataplus._M_p;
    bVar5 = evaluate(this,*(Formula **)(formula + 1),uVar15);
    bVar6 = 1;
    if ((byte)(bVar19 ^ 1 | bVar5) == 1) {
      bVar4 = evaluate(this,pFVar8,uVar15);
      if (bVar19 == 0) {
        bVar6 = bVar4 ^ bVar16 ^ bVar5;
      }
      else {
        bVar6 = bVar4 || !bVar5;
      }
    }
    goto LAB_002a64a8;
  default:
    puVar9 = (undefined8 *)__cxa_allocate_exception(0x50);
    Kernel::Formula::toString_abi_cxx11_(&local_100,formula);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130,
                   "Cannot evaluate ",&local_100);
    plVar10 = (long *)std::__cxx11::string::append(local_130);
    local_d0 = (long *)*plVar10;
    plVar13 = plVar10 + 2;
    if (local_d0 == plVar13) {
      local_c0 = *plVar13;
      uStack_b8 = (undefined4)plVar10[3];
      uStack_b4 = *(undefined4 *)((long)plVar10 + 0x1c);
      local_d0 = &local_c0;
    }
    else {
      local_c0 = *plVar13;
    }
    local_c8 = plVar10[1];
    *plVar10 = (long)plVar13;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    *puVar9 = &PTR_cry_00b3dfc0;
    puVar9[1] = puVar9 + 3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar9 + 1),local_d0,local_c8 + (long)local_d0);
    *puVar9 = &PTR_cry_00b3e0a8;
    *(undefined4 *)(puVar9 + 5) = 0;
    puVar9[6] = puVar9 + 8;
    puVar9[7] = 0;
    *(undefined1 *)(puVar9 + 8) = 0;
    __cxa_throw(puVar9,&Lib::UserErrorException::typeinfo,
                Lib::UserErrorException::~UserErrorException);
  case FORALL:
    uVar17 = CONCAT71((int7)((ulong)unaff_R12 >> 8),1);
    goto LAB_002a630c;
  case EXISTS:
    uVar17 = 0;
LAB_002a630c:
    puVar2 = *(uint **)(formula + 1);
    var = *puVar2;
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            CONCAT44((int)((ulong)in_stack_fffffffffffffec0 >> 0x20),(int)uVar17);
    local_108 = this;
    if (*(long *)(puVar2 + 2) == 0) {
      pFVar8 = (Formula *)formula[1]._label._M_string_length;
    }
    else {
      pFVar8 = (Formula *)
               Lib::FixedSizeAllocator<64UL>::alloc
                         ((FixedSizeAllocator<64UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
      uVar1 = puVar2[2];
      uVar18 = puVar2[3];
      sVar3 = formula[1]._label._M_string_length;
      pFVar8->_connective = formula->_connective;
      (pFVar8->_label)._M_dataplus._M_p = (pointer)&(pFVar8->_label).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pFVar8->_label,Kernel::Formula::DEFAULT_LABEL_abi_cxx11_,
                 DAT_00b50330 + Kernel::Formula::DEFAULT_LABEL_abi_cxx11_);
      pFVar8[1]._connective = uVar1;
      *(uint *)&pFVar8[1].field_0x4 = uVar18;
      pFVar8[1]._label._M_dataplus._M_p = (pointer)0x0;
      pFVar8[1]._label._M_string_length = sVar3;
      uVar17 = (ulong)__lhs & 0xffffffff;
    }
    local_d8._content = 2;
    bVar5 = Kernel::SortHelper::tryGetVariableSort(var,formula,&local_d8);
    this_00 = local_108;
    if (!bVar5) {
      auVar20 = __cxa_allocate_exception(0x50);
      puVar9 = auVar20._0_8_;
      Lib::Int::toString_abi_cxx11_(&local_b0,(Int *)(ulong)var,auVar20._8_4_);
      std::operator+(&local_100,"Failed to get sort of ",&local_b0);
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_100);
      local_130._0_8_ = *plVar10;
      plVar13 = plVar10 + 2;
      if ((long *)local_130._0_8_ == plVar13) {
        local_130._16_4_ = (undefined4)*plVar13;
        local_130._20_4_ = (undefined4)((ulong)*plVar13 >> 0x20);
        local_130._24_4_ = (undefined4)plVar10[3];
        local_130._28_4_ = (undefined4)((ulong)plVar10[3] >> 0x20);
        local_130._0_8_ = local_130 + 0x10;
      }
      else {
        local_130._16_4_ = (undefined4)*plVar13;
        local_130._20_4_ = (undefined4)((ulong)*plVar13 >> 0x20);
      }
      local_130._8_4_ = (undefined4)plVar10[1];
      local_130._12_4_ = (undefined4)((ulong)plVar10[1] >> 0x20);
      *plVar10 = (long)plVar13;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      Kernel::Formula::toString_abi_cxx11_(&local_50,formula);
      std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
      *puVar9 = &PTR_cry_00b3dfc0;
      puVar9[1] = puVar9 + 3;
      std::__cxx11::string::_M_construct<char*>((string *)(puVar9 + 1),local_90,local_88 + local_90)
      ;
      *puVar9 = &PTR_cry_00b3e0a8;
      *(undefined4 *)(puVar9 + 5) = 0;
      puVar9[6] = puVar9 + 8;
      puVar9[7] = 0;
      *(undefined1 *)(puVar9 + 8) = 0;
      __cxa_throw(puVar9,&Lib::UserErrorException::typeinfo,
                  Lib::UserErrorException::~UserErrorException);
    }
    uVar1 = *(uint *)(local_d8._content + 8);
    if ((local_108->_sizes)._array[uVar1] != 0) {
      bVar6 = (byte)uVar17 ^ 1;
      uVar18 = 1;
      local_e0 = pFVar8;
      do {
        local_130._0_4_ = 1;
        local_130._20_4_ = 0;
        local_130._24_4_ = 0;
        local_130._28_4_ = 0;
        uStack_110 = 0;
        local_130._4_4_ = 0;
        local_130._8_4_ = 0;
        local_130._12_4_ = 0;
        local_130._16_4_ = 0;
        local_10c = 0;
        __addr = getDomainConstant(this_00,uVar18,uVar1);
        Kernel::Substitution::bind
                  ((Substitution *)local_130,var,(sockaddr *)__addr,(socklen_t)puVar11);
        pFVar8 = Kernel::SubstHelper::applyImpl<false,Kernel::Substitution>
                           (local_e0,(Substitution *)local_130,false);
        pFVar8 = Shell::SimplifyFalseTrue::simplify(pFVar8);
        pFVar8 = Shell::Flattening::flatten(pFVar8);
        bVar5 = evaluate(this_00,pFVar8,uVar15);
        if (!bVar5 && bVar6 == 0) {
          Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
                    ((DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *)
                     local_130);
          __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          break;
        }
        cVar21 = (char)__lhs;
        Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
                  ((DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *)
                   local_130);
        if (bVar5 && cVar21 == '\0') {
          __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
          break;
        }
        uVar18 = uVar18 + 1;
      } while (uVar18 <= (this_00->_sizes)._array[uVar1]);
    }
    bVar6 = (byte)__lhs;
    goto LAB_002a64a8;
  case FALSE:
switchD_002a61f6_caseD_a:
    bVar6 = 0;
    goto LAB_002a64a8;
  case TRUE:
    goto switchD_002a61f6_caseD_b;
  }
  puVar9 = *(undefined8 **)(formula + 1);
  do {
    if (puVar9 == (undefined8 *)0x0) goto LAB_002a64a8;
    pFVar8 = (Formula *)*puVar9;
    puVar9 = (undefined8 *)puVar9[1];
    bVar5 = evaluate(this,pFVar8,uVar15);
    if ((byte)(bVar5 | bVar6 ^ 1) != 1) goto switchD_002a61f6_caseD_a;
  } while (!bVar5 || bVar6 != 0);
switchD_002a61f6_caseD_b:
  bVar6 = 1;
LAB_002a64a8:
  return (bool)((bVar14 ^ bVar6) & 1);
}

Assistant:

bool FiniteModelMultiSorted::evaluate(Formula* formula,unsigned depth)
{
#if DEBUG_MODEL
  for(unsigned i=0;i<depth;i++){ cout << "."; }
  cout << "Evaluating..." << formula->toString() << endl;
#endif

  bool isAnd = false;
  bool isImp = false;
  bool isXor = false;
  bool isForall = false;
  switch(formula->connective()){
    // If it's a literal evaluate that
    case LITERAL:
    {
      Literal* lit = formula->literal();
      if(!lit->ground()){
        USER_ERROR("Was not expecting free variables in "+formula->toString());
      }
      return evaluateGroundLiteral(lit);
    }

    // Expand the standard ones
    case FALSE:
      return false;
    case TRUE:
      return true;
    case NOT:
      return !evaluate(formula->uarg(),depth+1);
    case AND:
      isAnd=true;
    case OR:
      {
        FormulaList* args = formula->args();
        FormulaList::Iterator fit(args);
        while(fit.hasNext()){
          Formula* arg = fit.next();
          bool res = evaluate(arg,depth+1);
          if(isAnd && !res) return false;
          if(!isAnd && res) return true;
        }
        return isAnd;
      }

    case IMP:
     isImp=true;
    case XOR:
     isXor = !isImp;
    case IFF:
    {
      Formula* left = formula->left();
      Formula* right = formula->right();
      bool left_res = evaluate(left,depth+1);
      if(isImp && !left_res) return true;
      bool right_res = evaluate(right,depth+1);

#if DEBUG_MODEL
      cout << "left_res is " << left_res << ", right_res is " << right_res << endl;
#endif

      if(isImp) return !left_res || right_res;
      if(isXor) return left_res != right_res;
      return left_res == right_res; // IFF
    }

    // Expand quantifications
    case FORALL:
     isForall = true;
    case EXISTS:
    {
     VList* vs = formula->vars();
     int var = vs->head();

     //cout << "Quant " << isForall << " with " << var << endl;

     Formula* next = 0;
     if(vs->tail()) next = new QuantifiedFormula(formula->connective(),vs->tail(),0,formula->qarg());
     else next = formula->qarg();

     TermList srt;
     if(!SortHelper::tryGetVariableSort(var,formula,srt)){
       USER_ERROR("Failed to get sort of "+Lib::Int::toString(var)+" in "+formula->toString());
     }

     unsigned srtU = srt.term()->functor();
     for(unsigned c=1;c<=_sizes[srtU];c++){
       Substitution s;
       s.bind(var,getDomainConstant(c,srtU));
       Formula* next_sub = SubstHelper::apply(next,s);
       next_sub = SimplifyFalseTrue::simplify(next_sub);
       next_sub = Flattening::flatten(next_sub);

       bool res = evaluate(next_sub,depth+1);

       //TODO try and limit memory issues!
       //     ideally delete the bits introduced by the application of SubstHelper::apply
       //if(next_sub!=next) next_sub->destroy();

       if(isForall && !res) return false;
       if(!isForall && res) return true;
     }

     return isForall;
    }
    default:
      USER_ERROR("Cannot evaluate " + formula->toString() + ", not supported");
  }

  NOT_IMPLEMENTED;
  return false;
}